

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  bool bVar1;
  reference stats;
  AssertionStats *assertion;
  const_iterator __end1;
  const_iterator __begin1;
  Assertions *__range1;
  SectionNode *sectionNode_local;
  JunitReporter *this_local;
  
  __end1 = clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::begin
                     (&sectionNode->assertions);
  assertion = (AssertionStats *)
              clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::end
                        (&sectionNode->assertions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
                                *)&assertion);
    if (!bVar1) break;
    stats = __gnu_cxx::
            __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
            ::operator*(&__end1);
    writeAssertion(this,stats);
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void JunitReporter::writeAssertions( SectionNode const& sectionNode ) {
        for( auto const& assertion : sectionNode.assertions )
            writeAssertion( assertion );
    }